

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

uint32 __thiscall
Js::WebAssemblyEnvironment::GetElementSegmentOffset(WebAssemblyEnvironment *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  WebAssemblyModule *pWVar5;
  ScriptContext *scriptContext;
  uint32 index_local;
  WebAssemblyEnvironment *this_local;
  
  if ((this->offsetInitialized & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xea,"(offsetInitialized)","offsetInitialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pWVar5 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
  uVar3 = WebAssemblyModule::GetElementSegCount(pWVar5);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xed,"((0))","We should only be using valid indexes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    pWVar5 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)pWVar5);
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,(PCWSTR)0x0);
  }
  return this->elementSegmentOffsets[index];
}

Assistant:

uint32 WebAssemblyEnvironment::GetElementSegmentOffset(uint32 index) const
{
    Assert(offsetInitialized);
    if (index >= module->GetElementSegCount())
    {
        AssertMsg(UNREACHED, "We should only be using valid indexes");
        JavascriptError::ThrowRangeError(module->GetScriptContext(), JSERR_ArgumentOutOfRange);
    }
    return elementSegmentOffsets[index];
}